

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msk.cpp
# Opt level: O3

int processMsk4(istream *in,path *output)

{
  pointer data;
  bool bVar1;
  runtime_error *prVar2;
  long *plVar3;
  size_type *psVar4;
  Size size;
  uint __val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressedData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedData;
  Msk4Header header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  Msk4Header local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  operator>>(in,&local_bc);
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_158,(ulong)(local_bc.dataSize - 4));
  std::istream::seekg((long)in,local_bc.dataOffset + 4);
  std::istream::read((char *)in,
                     (long)local_158.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  bVar1 = decompressHigu(&local_178,
                         local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (int)local_158.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)local_158.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,true);
  data = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Decompression failed");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __val = (uint)local_bc.height * (uint)local_bc.width;
  if ((long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (ulong)__val) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
    size.height._0_2_ = local_bc.height;
    size.width = (uint)local_bc.width;
    size.height._2_2_ = 0;
    writePNG(output,GRAY,size,data,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_e0,__val);
  std::operator+(&local_70,"Expected ",&local_e0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_120._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar4) {
    local_120.field_2._M_allocated_capacity = *psVar4;
    local_120.field_2._8_8_ = plVar3[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar4;
  }
  local_120._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string
            (&local_90,
             (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::operator+(&local_50,&local_120,&local_90);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_100._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar4) {
    local_100.field_2._M_allocated_capacity = *psVar4;
    local_100.field_2._8_4_ = (undefined4)plVar3[3];
    local_100.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar4;
  }
  local_100._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,currentFileName_abi_cxx11_._M_pathname._M_dataplus._M_p,
             currentFileName_abi_cxx11_._M_pathname._M_dataplus._M_p +
             currentFileName_abi_cxx11_._M_pathname._M_string_length);
  std::operator+(&local_140,&local_100,&local_b0);
  std::runtime_error::runtime_error(prVar2,(string *)&local_140);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int processMsk4(std::istream &in, const fs::path &output) {
	Msk4Header header;
	in >> header;
	Size size { header.width, header.height };

	std::vector<uint8_t> compressedData, decompressedData;
	// First thing in data is its size (uint32)
	compressedData.resize(header.dataSize - 4);
	in.seekg(header.dataOffset + 4, in.beg);
	in.read((char *)compressedData.data(), compressedData.size());

	// TODO: Figure out what the stuff between the header and data is

	if (!decompressHigu(decompressedData, compressedData.data(), (int)compressedData.size(), true)) {
		throw std::runtime_error("Decompression failed");
	}

	if (decompressedData.size() != size.area()) {
		throw std::runtime_error("Expected " + std::to_string(size.area()) + " bytes but got " + std::to_string(decompressedData.size()) + " bytes when processing " + currentFileName.string());
	}

	writePNG(output, PNGColorType::GRAY, size, decompressedData.data());

	return 0;
}